

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Read.h
# Opt level: O0

void __thiscall Read::Read(Read *this,string *name,Token *token)

{
  string local_40;
  Token *local_20;
  Token *token_local;
  string *name_local;
  Read *this_local;
  
  local_20 = token;
  token_local = (Token *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  AST::ASTNode::ASTNode(&this->super_ASTNode,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_001a3a20;
  return;
}

Assistant:

Read(std::string name, Token *token) : ASTNode(std::move(name), token) {}